

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::ScriptFunction::ScriptFunction
          (ScriptFunction *this,FunctionProxy *proxy,ScriptFunctionType *type)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  FunctionInfo *pFVar4;
  FunctionProxy *pFVar5;
  undefined4 *puVar6;
  ScriptFunctionType *pSVar7;
  FunctionBody *this_00;
  FunctionEntryPointInfo *this_01;
  ScriptContext *pSVar8;
  FunctionBody *body;
  ScriptFunctionType *local_20;
  ScriptFunctionType *type_local;
  FunctionProxy *proxy_local;
  ScriptFunction *this_local;
  
  local_20 = type;
  type_local = (ScriptFunctionType *)proxy;
  proxy_local = (FunctionProxy *)this;
  pFVar4 = FunctionProxy::GetFunctionInfo(proxy);
  ScriptFunctionBase::ScriptFunctionBase
            (&this->super_ScriptFunctionBase,&type->super_DynamicType,pFVar4);
  (this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e41470;
  Memory::WriteBarrierPtr<Js::FrameDisplay>::WriteBarrierPtr
            (&this->environment,(FrameDisplay *)&NullFrameDisplay);
  body = (FunctionBody *)0x0;
  Memory::WriteBarrierPtr<Js::ActivationObjectEx>::WriteBarrierPtr(&this->cachedScopeObj,&body);
  this->hasInlineCaches = false;
  pFVar4 = FunctionProxy::GetFunctionInfo((FunctionProxy *)type_local);
  pFVar5 = FunctionInfo::GetFunctionProxy(pFVar4);
  if (pFVar5 != (FunctionProxy *)type_local) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x22,"(proxy->GetFunctionInfo()->GetFunctionProxy() == proxy)",
                                "proxy->GetFunctionInfo()->GetFunctionProxy() == proxy");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pSVar7 = FunctionProxy::GetDeferredPrototypeType((FunctionProxy *)type_local);
  if ((pSVar7 != local_20) &&
     (pSVar7 = FunctionProxy::GetUndeferredFunctionType((FunctionProxy *)type_local),
     pSVar7 != local_20)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x23,
                                "(proxy->GetDeferredPrototypeType() == type || proxy->GetUndeferredFunctionType() == type)"
                                ,
                                "proxy->GetDeferredPrototypeType() == type || proxy->GetUndeferredFunctionType() == type"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  JavascriptFunction::VerifyEntryPoint((JavascriptFunction *)this);
  bVar2 = FunctionProxy::IsDeferred((FunctionProxy *)type_local);
  if (!bVar2) {
    this_00 = FunctionProxy::GetFunctionBody((FunctionProxy *)type_local);
    bVar2 = FunctionBody::GetNativeEntryPointUsed(this_00);
    if (!bVar2) {
      this_01 = FunctionBody::GetDefaultFunctionEntryPointInfo(this_00);
      bVar2 = EntryPointInfo::IsCodeGenDone(&this_01->super_EntryPointInfo);
      if (bVar2) {
        MemoryBarrier();
        uVar3 = FunctionBody::GetByteCodeCount(this_00);
        pSVar8 = Js::Type::GetScriptContext((Type *)local_20);
        pSVar8->jitCodeUsed = uVar3 + pSVar8->jitCodeUsed;
        pSVar8 = Js::Type::GetScriptContext((Type *)local_20);
        pSVar8->funcJitCodeUsed = pSVar8->funcJitCodeUsed + 1;
        FunctionBody::SetNativeEntryPointUsed(this_00,true);
      }
    }
  }
  return;
}

Assistant:

ScriptFunction::ScriptFunction(FunctionProxy * proxy, ScriptFunctionType* type)
        : ScriptFunctionBase(type, proxy->GetFunctionInfo()),
        environment((FrameDisplay*)&NullFrameDisplay), cachedScopeObj(nullptr),
        hasInlineCaches(false)
    {
        Assert(proxy->GetFunctionInfo()->GetFunctionProxy() == proxy);
        Assert(proxy->GetDeferredPrototypeType() == type || proxy->GetUndeferredFunctionType() == type);
        DebugOnly(VerifyEntryPoint());

#if ENABLE_NATIVE_CODEGEN
        if (!proxy->IsDeferred())
        {
            FunctionBody* body = proxy->GetFunctionBody();
            if(!body->GetNativeEntryPointUsed() &&
                body->GetDefaultFunctionEntryPointInfo()->IsCodeGenDone())
            {
                MemoryBarrier();
#ifdef BGJIT_STATS
                type->GetScriptContext()->jitCodeUsed += body->GetByteCodeCount();
                type->GetScriptContext()->funcJitCodeUsed++;
#endif
                body->SetNativeEntryPointUsed(true);
            }
        }
#endif
    }